

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBFabFactory.cpp
# Opt level: O1

int __thiscall amrex::EBFArrayBoxFactory::maxCoarseningLevel(EBFArrayBoxFactory *this)

{
  int iVar1;
  
  if (this->m_parent == (Level *)0x0) {
    iVar1 = EB2::maxCoarseningLevel(&this->m_geom);
  }
  else {
    iVar1 = EB2::maxCoarseningLevel(this->m_parent->m_parent,&this->m_geom);
  }
  return iVar1;
}

Assistant:

int
EBFArrayBoxFactory::maxCoarseningLevel () const noexcept
{
    if (m_parent) {
        EB2::IndexSpace const* ebis = m_parent->getEBIndexSpace();
        return EB2::maxCoarseningLevel(ebis, m_geom);
    } else {
        return EB2::maxCoarseningLevel(m_geom);
    }
}